

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

bool __thiscall lattice::supercell::within_supercell(supercell *this,offset_t *cell)

{
  bool bVar1;
  size_t m;
  ulong index;
  CoeffReturnType CVar2;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>
  p;
  MatrixXd *local_38;
  offset_t *local_30;
  
  local_38 = &this->rs_;
  bVar1 = true;
  index = 0;
  local_30 = cell;
  do {
    if (this->dim_ <= index) {
      return bVar1;
    }
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
            ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                     *)&local_38,index);
    if (CVar2 < -1e-08) {
LAB_00110808:
      bVar1 = false;
    }
    else {
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>,_0>,_0>
              ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<long,_double>,_const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_>,_0>,_0>
                       *)&local_38,index);
      if (0.99999999 < CVar2) goto LAB_00110808;
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool within_supercell(const offset_t& cell) const {
    const double eps = 1.0e-8;
    auto p = rs_ * cell.cast<double>();
    bool res = true;
    for (std::size_t m = 0; m < dim_; ++m) {
      if (p(m) < -eps || p(m) > (1.0 - eps)) res = false;
    }
    return res;
  }